

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O2

void __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::Initialize2DBN
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,ScopeFunctor *SetScopes,
          TransitionProbFunctor *ComputeTransitionProb,
          ObservationProbFunctor *ComputeObservationProb)

{
  TwoStageDynamicBayesianNetwork *this_00;
  pointer pSVar1;
  size_t X;
  pointer pSVar2;
  pointer pSVar3;
  pointer puVar4;
  long lVar5;
  pointer pSVar6;
  pointer puVar7;
  pointer puVar8;
  long lVar9;
  long lVar10;
  TwoStageDynamicBayesianNetwork *pTVar11;
  bool bVar12;
  byte bVar13;
  Index IVar14;
  ulong uVar15;
  const_reference pvVar16;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar17;
  CPT *this_01;
  reference ppCVar18;
  E *pEVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  Index yVal;
  Index oVal;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar23;
  allocator_type local_139;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_138;
  CPT *local_130;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_128;
  vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *local_120;
  MultiAgentDecisionProcessDiscreteFactoredStates *local_118;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_110;
  vector<unsigned_int,_std::allocator<unsigned_int>_> As;
  undefined4 local_ec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Xs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Ys;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Ys_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> r_nrY;
  vector<unsigned_long,_std::allocator<unsigned_long>_> r_nrA;
  vector<unsigned_long,_std::allocator<unsigned_long>_> r_nrX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Xs_1;
  
  this_00 = &this->_m_2dbn;
  TwoStageDynamicBayesianNetwork::InitializeStorage(this_00);
  (**SetScopes->_vptr_ScopeFunctor)(SetScopes);
  this->_m_connectionsSpecified = true;
  TwoStageDynamicBayesianNetwork::InitializeIIs(this_00);
  local_128 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xb8))(this);
  local_120 = &(this->_m_2dbn)._m_Y_CPDs;
  uVar21 = 0;
  local_118 = this;
  while( true ) {
    uVar22 = (ulong)uVar21;
    uVar15 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0xa8))(this);
    if (uVar15 <= uVar22) break;
    dVar23 = extraout_XMM0_Qa;
    pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(local_128,uVar22);
    pSVar1 = (this->_m_2dbn)._m_XSoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
             super__Vector_impl_data._M_start;
    X = *pvVar16;
    pSVar2 = (this->_m_2dbn)._m_ASoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar3 = (this->_m_2dbn)._m_YSoI_Y.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = pSVar1[uVar22].super_SDT.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar5 = *(long *)&pSVar1[uVar22].super_SDT.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
    local_138 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                ((long)pSVar2[uVar22].super_SDT.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                *(long *)&pSVar2[uVar22].super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl);
    local_130 = (CPT *)((long)pSVar3[uVar22].super_SDT.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       *(long *)&pSVar3[uVar22].super_SDT.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl);
    pvVar17 = TwoStageDynamicBayesianNetwork::GetNrVals_XSoI_Y(this_00,uVar21);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&r_nrX,pvVar17);
    pvVar17 = TwoStageDynamicBayesianNetwork::GetNrVals_ASoI_Y(this_00,uVar21);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&r_nrA,pvVar17);
    pvVar17 = TwoStageDynamicBayesianNetwork::GetNrVals_YSoI_Y(this_00,uVar21);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&r_nrY,pvVar17);
    pvVar17 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              TwoStageDynamicBayesianNetwork::GetiiSize_Y(this_00,uVar21);
    this_01 = (CPT *)operator_new(0x30);
    local_110 = pvVar17;
    CPT::CPT(this_01,X,(size_t)pvVar17);
    As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&Xs,(long)puVar4 - lVar5 >> 2,(value_type_conflict1 *)&As,(allocator_type *)&Ys);
    Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&As,(long)local_138 >> 2,(value_type_conflict1 *)&Ys,(allocator_type *)&Ys_1);
    Ys_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&Ys,(long)local_130 >> 2,(value_type_conflict1 *)&Ys_1,(allocator_type *)&Xs_1);
    pvVar17 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    do {
      do {
        do {
          local_138 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      ((long)&(pvVar17->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start + 1);
          for (uVar15 = 0; uVar15 < X; uVar15 = (ulong)((int)uVar15 + 1)) {
            (**ComputeTransitionProb->_vptr_TransitionProbFunctor)
                      (ComputeTransitionProb,uVar22,uVar15,&Xs,&As,(allocator_type *)&Ys);
            if (1e-12 < dVar23) {
              IVar14 = TwoStageDynamicBayesianNetwork::IndividualToJointYiiIndices
                                 (this_00,uVar21,&Xs,&As,&Ys);
              (*(this_01->super_CPDDiscreteInterface)._vptr_CPDDiscreteInterface[3])
                        (this_01,uVar15,(ulong)IVar14);
            }
          }
          bVar12 = IndexTools::Increment(&Ys,&r_nrY);
          pvVar17 = local_138;
        } while (!bVar12);
        bVar12 = IndexTools::Increment(&As,&r_nrA);
      } while (!bVar12);
      bVar12 = IndexTools::Increment(&Xs,&r_nrX);
    } while (!bVar12);
    if (local_110 != pvVar17) {
      pEVar19 = (E *)__cxa_allocate_exception(0x28);
      E::E(pEVar19,"ii_size != ii_size2 ");
      __cxa_throw(pEVar19,&E::typeinfo,E::~E);
    }
    ppCVar18 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::at
                         (local_120,uVar22);
    this = local_118;
    *ppCVar18 = (value_type)this_01;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&Ys);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&Xs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&r_nrY.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&r_nrA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&r_nrX.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    uVar21 = uVar21 + 1;
  }
  if (ComputeObservationProb->_m_isEmpty == false) {
    local_120 = (vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)
                (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x160))(this);
    pTVar11 = &this->_m_2dbn;
    uVar21 = 0;
    while( true ) {
      this = local_118;
      uVar22 = (ulong)uVar21;
      uVar15 = (**(code **)(*(long *)&local_118->super_MultiAgentDecisionProcess + 0x10))(local_118)
      ;
      if (uVar15 <= uVar22) break;
      pvVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_120,uVar22
                          );
      local_138 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)*pvVar16;
      pSVar1 = (this->_m_2dbn)._m_OSoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar2 = (this->_m_2dbn)._m_ASoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar3 = (this->_m_2dbn)._m_YSoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar6 = (this->_m_2dbn)._m_XSoI_O.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar4 = pSVar1[uVar22].super_SDT.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar7 = pSVar2[uVar22].super_SDT.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar8 = pSVar3[uVar22].super_SDT.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar5 = *(long *)&pSVar1[uVar22].super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
      lVar9 = *(long *)&pSVar2[uVar22].super_SDT.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
      lVar10 = *(long *)&pSVar3[uVar22].super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
      lVar20 = (long)pSVar6[uVar22].super_SDT.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               *(long *)&pSVar6[uVar22].super_SDT.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
      bVar13 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x1d0))(this);
      this->_m_eventObservability = (bool)(bVar13 | lVar20 != 0);
      dVar23 = extraout_XMM0_Qa_00;
      pvVar17 = TwoStageDynamicBayesianNetwork::GetNrVals_OSoI_O(this_00,uVar21);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&r_nrX,pvVar17);
      pvVar17 = TwoStageDynamicBayesianNetwork::GetNrVals_ASoI_O(this_00,uVar21);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&r_nrA,pvVar17);
      pvVar17 = TwoStageDynamicBayesianNetwork::GetNrVals_YSoI_O(this_00,uVar21);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&r_nrY,pvVar17);
      pvVar17 = TwoStageDynamicBayesianNetwork::GetNrVals_XSoI_O(this_00,uVar21);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&Xs,pvVar17);
      local_128 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  TwoStageDynamicBayesianNetwork::GetiiSize_O(this_00,uVar21);
      local_130 = (CPT *)operator_new(0x30);
      CPT::CPT(local_130,(size_t)local_138,(size_t)local_128);
      Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&As,(long)puVar4 - lVar5 >> 2,(value_type_conflict1 *)&Ys,(allocator_type *)&Ys_1);
      Ys_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&Ys,(long)puVar7 - lVar9 >> 2,(value_type_conflict1 *)&Ys_1,(allocator_type *)&Xs_1
                );
      Xs_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&Ys_1,(long)puVar8 - lVar10 >> 2,(value_type_conflict1 *)&Xs_1,
                 (allocator_type *)&local_ec);
      local_ec = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&Xs_1,lVar20 >> 2,(value_type_conflict1 *)&local_ec,&local_139);
      pvVar17 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
LAB_004c17c9:
      do {
        do {
          do {
            local_110 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        ((long)&(pvVar17->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start + 1);
            pvVar17 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
            while( true ) {
              if (local_138 <= pvVar17) break;
              (**ComputeObservationProb->_vptr_ObservationProbFunctor)
                        (ComputeObservationProb,(ulong)uVar21,pvVar17,
                         &Xs_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,&Ys,
                         &Ys_1,&As);
              IVar14 = TwoStageDynamicBayesianNetwork::IndividualToJointOiiIndices
                                 (this_00,uVar21,
                                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  &Xs_1.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                                  &Ys,&Ys_1,&As);
              if (1e-12 < dVar23) {
                (*(local_130->super_CPDDiscreteInterface)._vptr_CPDDiscreteInterface[3])
                          (local_130,pvVar17,(ulong)IVar14);
              }
              pvVar17 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        (ulong)((int)pvVar17 + 1);
            }
            bVar12 = IndexTools::Increment(&As,&r_nrX);
            pvVar17 = local_110;
          } while (!bVar12);
          bVar12 = IndexTools::Increment(&Ys_1,&r_nrY);
        } while (!bVar12);
        if (local_118->_m_eventObservability == true) {
          bVar12 = IndexTools::Increment
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              &Xs_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                              (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&Xs);
          if (!bVar12) goto LAB_004c17c9;
        }
        bVar12 = IndexTools::Increment(&Ys,&r_nrA);
      } while (!bVar12);
      if (local_128 != pvVar17) {
        pEVar19 = (E *)__cxa_allocate_exception(0x28);
        E::E(pEVar19,"ii_size != ii_size2 ");
        __cxa_throw(pEVar19,&E::typeinfo,E::~E);
      }
      ppCVar18 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::at
                           (&pTVar11->_m_O_CPDs,uVar22);
      *ppCVar18 = &local_130->super_CPDDiscreteInterface;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&Xs_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&Ys_1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&Ys.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&As.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&Xs);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&r_nrY.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&r_nrA.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&r_nrX.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      uVar21 = uVar21 + 1;
    }
  }
  SetInitialized(this,true);
  return;
}

Assistant:

void MultiAgentDecisionProcessDiscreteFactoredStates::Initialize2DBN(ScopeFunctor& SetScopes,
                                                                     TransitionProbFunctor& ComputeTransitionProb,
                                                                     ObservationProbFunctor& ComputeObservationProb)
{
//Initialize storage in the 2DBN
    _m_2dbn.InitializeStorage(); 
#if DEBUG_2DBN
    cout << "MultiAgentDecisionProcessDiscreteFactoredStates: 2DBN storage initialized"<<endl;
    cout << _m_2dbn.SoftPrint();
#endif
    SetScopes();
    SetConnectionsSpecified(true);
#if DEBUG_2DBN
    cout << "MultiAgentDecisionProcessDiscreteFactoredStates::scopes set and thus all connections specified"<<endl;
    cout << _m_2dbn.SoftPrint();
#endif

//initialize II meta-information
    _m_2dbn.InitializeIIs();

    const vector<size_t>& nryVals = GetNrValuesPerFactor();
//Create Transition model
#if DEBUG_2DBN
    if(DEBUG_2DBN) cout << ">>>Adding Transition model..."<<endl;
#endif
    //For each state factor, we create the CPT here
    for(Index y=0; y< GetNrStateFactors(); y++)
    {
#if DEBUG_2DBN
        cout << "Creating CPT for sfI=" << GetStateFactorDiscrete(y)->GetName() << endl;
#endif
        //1)determine the SoI(y)
        //2)allocate the CPT
        //3)fill it up
        //4)attach it to 2BDN
        
        //determine the SoI(y)
        size_t nrVals_y = nryVals.at(y);
        const Scope& XSoI_y = _m_2dbn.GetXSoI_Y(y);
        const Scope& ASoI_y = _m_2dbn.GetASoI_Y(y);
        const Scope& YSoI_y = _m_2dbn.GetYSoI_Y(y);
        size_t XSoI_y_size = XSoI_y.size();
        size_t ASoI_y_size = ASoI_y.size();
        size_t YSoI_y_size = YSoI_y.size();
        
        vector<size_t> r_nrX = _m_2dbn.GetNrVals_XSoI_Y(y);
        vector<size_t> r_nrA = _m_2dbn.GetNrVals_ASoI_Y(y);
        vector<size_t> r_nrY = _m_2dbn.GetNrVals_YSoI_Y(y);

        size_t ii_size = _m_2dbn.GetiiSize_Y(y);

        //2)allocate the CPT
        CPT* cpt = new CPT(nrVals_y, ii_size);

        //3)fill it up
        vector<Index> Xs(XSoI_y_size, 0 );
        vector<Index> As(ASoI_y_size, 0 );
        vector<Index> Ys(YSoI_y_size, 0 );
        size_t ii_size2=0;
#if DEBUG_2DBN
        cout << "starting loop through Xs of size " << XSoI_y_size << endl;
#endif
        do{
#if DEBUG_2DBN
          //            cout << SoftPrintVector(Xs) << " - PS state is " <<
          //      SoftPrintPartialState(XSoI_y, Xs) << endl;
#endif
            do{
#if DEBUG_2DBN
                cout << "\ta="<< SoftPrintVector(As) << " (scope="<<
                    ASoI_y <<")" << endl;
#endif
                do{
#if DEBUG_2DBN
                    cout << "\t\t";// << SoftPrintVector(Ys);
#endif
                    ii_size2++;
                    for(Index yVal=0; yVal < nrVals_y; yVal++)
                    {
                        //compute P(y = yVal | ii=<Xs, As, Ys>) :
                        double p = ComputeTransitionProb(y, yVal, Xs,As,Ys);
                        
                        if(p > Globals::PROB_PRECISION)
                        {
#if DEBUG_2DBN
                            cout << "P("<<GetStateFactorDiscrete(y)->GetName()<<":"<<GetStateFactorDiscrete(y)->GetStateFactorValue(yVal)<<"|...)=";
                            printf("%.3f, ", p);
#endif
                            Index iiI = _m_2dbn.IndividualToJointYiiIndices(
                                y, Xs, As, Ys);
                            cpt->Set(yVal, iiI, p);
                        }
                    }
#if DEBUG_2DBN
                    cout << endl;
#endif

                } while(! IndexTools::Increment( Ys, r_nrY ) ); 

            } while(! IndexTools::Increment( As, r_nrA ) ); 

        } while(! IndexTools::Increment( Xs, r_nrX ) ); 
        //cout << "ii_size:" << ii_size << ", ii_size2:" << ii_size2 << endl;
        if (ii_size != ii_size2 )
            throw E("ii_size != ii_size2 ");

        //4)attach it to 2BDN
        _m_2dbn.SetCPD_Y(y, cpt);
    }//end (for y)

    //Only continue if an initialization function for observation probabilities is given
    if(!ComputeObservationProb.isEmpty())
    {
        const vector<size_t>& nroVals = GetNrObservations();
//Create the observation model    
#if DEBUG_2DBN
        cout << ">>>Adding Observation model..."<<endl;
#endif
        //For each observation, we create the CPT here
        for(Index o=0; o < GetNrAgents(); o++)
        {
#if DEBUG_2DBN
            cout << "Creating CPT for oI (i.e., agentI)=" << o << endl;
#endif
            //1)determine the SoI(o)
            //2)allocate the CPT
            //3)fill it up
            //4)attach it to 2BDN
        
            //determine the SoI(o)
            size_t nrVals_o = nroVals.at(o);
            const Scope& OSoI_o = _m_2dbn.GetOSoI_O(o);
            const Scope& ASoI_o = _m_2dbn.GetASoI_O(o);
            const Scope& YSoI_o = _m_2dbn.GetYSoI_O(o);
            const Scope& XSoI_o = _m_2dbn.GetXSoI_O(o);
            size_t OSoI_o_size = OSoI_o.size();
            size_t ASoI_o_size = ASoI_o.size();
            size_t YSoI_o_size = YSoI_o.size();
            size_t XSoI_o_size = XSoI_o.size();
            
            SetEventObservability(GetEventObservability() || XSoI_o_size > 0); //if true, we use O(o,s,a,s') instead of O(o,a,s')
            
            vector<size_t> r_nrO = _m_2dbn.GetNrVals_OSoI_O(o);
            vector<size_t> r_nrA = _m_2dbn.GetNrVals_ASoI_O(o);
            vector<size_t> r_nrY = _m_2dbn.GetNrVals_YSoI_O(o);
            vector<size_t> r_nrX = _m_2dbn.GetNrVals_XSoI_O(o);
            
            size_t ii_size = _m_2dbn.GetiiSize_O(o);
            
            //2)allocate the CPT
            CPT* cpt = new CPT(nrVals_o, ii_size);
            
            //3)fill it up
            vector<Index> Os(OSoI_o_size, 0 );
            vector<Index> As(ASoI_o_size, 0 );
            vector<Index> Ys(YSoI_o_size, 0 );
            vector<Index> Xs(XSoI_o_size, 0 );
            size_t ii_size2=0;
#if DEBUG_2DBN
            cout << "starting loop through Os of size " << OSoI_o_size << endl;
#endif
            do{
                do{
#if DEBUG_2DBN
                    cout << SoftPrintVector(As)<<endl;
#endif
                    do{
                        bool skipY = false;
#if SKIP_IMPOSSIBLE_EVENTS
                        if(_m_eventObservability){
                          for(Index i = 0; i < YSoI_o_size; i++){
                              const Scope& XSoI_y = _m_2dbn.GetXSoI_Y(YSoI_o[i]);
                              const Scope& YSoI_y = _m_2dbn.GetYSoI_Y(YSoI_o[i]);
                              const Scope& ASoI_y = _m_2dbn.GetASoI_Y(YSoI_o[i]);
                              Scope Y;
                              if(XSoI_y.IsSubSetOf(XSoI_o) &&
                                 YSoI_y.IsSubSetOf(YSoI_o) &&
                                 ASoI_y.IsSubSetOf(ASoI_o)){ //I have enough information to know if these transitions are possible
                                Y.Insert(YSoI_o[i]);
                                vector<Index> yVal(1,Ys[YSoI_o[i]]);
                                if(_m_2dbn.GetYProbabilityGeneral(XSoI_o,Xs,
                                                                  ASoI_o,As,
                                                                  YSoI_o,Ys,
                                                                  Y,yVal) <= Globals::PROB_PRECISION){
                                  skipY = true;
                                  break;
                                }                              
                              }
                          }
                        }
#endif
#if DEBUG_2DBN
                  //                    cout << "\t" << SoftPrintVector(Ys) << " - NS state is " <<
                  //        SoftPrintPartialState(YSoI_o, Ys) << endl;
#endif
                        do{
#if DEBUG_2DBN
                          cout << "\t\t";// << SoftPrintVector(Os) //<-empty
#endif
                          ii_size2++;
                          for(Index oVal=0; oVal < nrVals_o; oVal++)
                            {
                              //compute P(o=oVal | ii=<Os, [Xs], As, Ys>) :
                              double p;
                              if(!skipY){
                                p = ComputeObservationProb(o, oVal, Xs, As, Ys, Os);
                              }else{
                                p = 1.0/(float) nrVals_o;
                              }
#if DEBUG_2DBN
                              cout << "P(o="<<oVal<<"|...)=";
                              printf("%.3f, ", p);
#endif
                              Index iiI = _m_2dbn.IndividualToJointOiiIndices(o, Xs, As, Ys, Os);
                              if(p > Globals::PROB_PRECISION)
                                cpt->Set(oVal, iiI, p);
                            }
#if DEBUG_2DBN
                          cout << endl;
#endif
                        } while(! IndexTools::Increment( Os, r_nrO ) ); 
                   
                    } while(! IndexTools::Increment( Ys, r_nrY ) ); 
                
                } while(_m_eventObservability && !IndexTools::Increment( Xs, r_nrX ) ); 
           
            } while(! IndexTools::Increment( As, r_nrA ) ); 
                
            //cout << "ii_size:" << ii_size << ", ii_size2:" << ii_size2 << endl;
            if (ii_size != ii_size2 )
                throw E("ii_size != ii_size2 ");
            
            //4)attach it to 2BDN
            _m_2dbn.SetCPD_O(o, cpt);
        }//end (for o)

    } else {
#if DEBUG_2DBN
        cout << ">>>Skipping addition of Observation model CPTs." << endl;
#endif
    }
    
    SetInitialized(true);
}